

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> * __thiscall
args::Command::GetAllFlags
          (vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> *__return_storage_ptr__,
          Command *this)

{
  pointer ppBVar1;
  int iVar2;
  pointer ppBVar3;
  vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> childFlags;
  void *local_40;
  undefined8 local_38;
  long local_30;
  
  (__return_storage_ptr__->super__Vector_base<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = (*(this->super_Group).super_Base._vptr_Base[2])(this);
  if ((char)iVar2 != '\0') {
    ppBVar3 = (this->super_Group).children.
              super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppBVar1 = (this->super_Group).children.
              super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppBVar3 != ppBVar1) {
      do {
        if ((this->selectedCommand == (Command *)0x0) || (((*ppBVar3)->options & Global) != None)) {
          (*(*ppBVar3)->_vptr_Base[9])(&local_40);
          std::vector<args::FlagBase*,std::allocator<args::FlagBase*>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<args::FlagBase**,std::vector<args::FlagBase*,std::allocator<args::FlagBase*>>>>
                    ((vector<args::FlagBase*,std::allocator<args::FlagBase*>> *)
                     __return_storage_ptr__,
                     (__return_storage_ptr__->
                     super__Vector_base<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>).
                     _M_impl.super__Vector_impl_data._M_finish,local_40,local_38);
          if (local_40 != (void *)0x0) {
            operator_delete(local_40,local_30 - (long)local_40);
          }
        }
        ppBVar3 = ppBVar3 + 1;
      } while (ppBVar3 != ppBVar1);
    }
    if (this->selectedCommand != (Command *)0x0) {
      (*(this->selectedCommand->super_Group).super_Base._vptr_Base[9])(&local_40);
      std::vector<args::FlagBase*,std::allocator<args::FlagBase*>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<args::FlagBase**,std::vector<args::FlagBase*,std::allocator<args::FlagBase*>>>>
                ((vector<args::FlagBase*,std::allocator<args::FlagBase*>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish,local_40,local_38);
      if (local_40 != (void *)0x0) {
        operator_delete(local_40,local_30 - (long)local_40);
      }
    }
    if (this->subparser != (Subparser *)0x0) {
      (*(this->subparser->super_Group).super_Base._vptr_Base[9])(&local_40);
      std::vector<args::FlagBase*,std::allocator<args::FlagBase*>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<args::FlagBase**,std::vector<args::FlagBase*,std::allocator<args::FlagBase*>>>>
                ((vector<args::FlagBase*,std::allocator<args::FlagBase*>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish,local_40,local_38);
      if (local_40 != (void *)0x0) {
        operator_delete(local_40,local_30 - (long)local_40);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<FlagBase*> GetAllFlags() override
            {
                std::vector<FlagBase*> res;

                if (!Matched())
                {
                    return res;
                }

                for (auto *child: Children())
                {
                    if (selectedCommand == nullptr || (child->GetOptions() & Options::Global) != Options::None)
                    {
                        auto childFlags = child->GetAllFlags();
                        res.insert(res.end(), childFlags.begin(), childFlags.end());
                    }
                }

                if (selectedCommand != nullptr)
                {
                    auto childFlags = selectedCommand->GetAllFlags();
                    res.insert(res.end(), childFlags.begin(), childFlags.end());
                }

                if (subparser != nullptr)
                {
                    auto childFlags = subparser->GetAllFlags();
                    res.insert(res.end(), childFlags.begin(), childFlags.end());
                }

                return res;
            }